

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

void __thiscall
capnp::compiler::ValueTranslator::fillStructValue
          (ValueTranslator *this,Builder builder,Reader assignments)

{
  short sVar1;
  ErrorReporter *pEVar2;
  Builder builder_00;
  Reader src;
  Reader src_00;
  Reader src_01;
  Field field;
  Field field_00;
  Reader assignments_00;
  ListElementCount LVar3;
  WirePointer *pWVar4;
  SegmentReader *pSVar5;
  CapTableReader *pCVar6;
  void *pvVar7;
  WirePointer *pWVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined4 uVar11;
  StructSchema SVar12;
  SegmentBuilder *pSVar13;
  CapTableBuilder *pCVar14;
  bool bVar15;
  char (*params) [20];
  Schema SVar16;
  char (*in_R8) [3];
  StringPtr SVar17;
  Type TVar18;
  StringPtr message;
  StringPtr message_00;
  Field groupField;
  undefined8 uStack_2c0;
  Reader value;
  IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
  local_280;
  FieldList groupFields;
  NullableValue<capnp::StructSchema::Field> _field2208;
  BuilderFor<capnp::DynamicStruct> groupBuilder;
  Orphan<capnp::DynamicValue> result;
  Reader local_c0;
  Reader fieldName;
  Reader assignment;
  
  LVar3 = assignments.reader.elementCount;
  local_280.container = &assignments;
  local_280.index = 0;
  do {
    if (local_280.index == LVar3) {
      return;
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Expression::Param,_(capnp::Kind)3>::Reader,_capnp::compiler::Expression::Param::Reader>
    ::operator*(&assignment,&local_280);
    if ((assignment._reader.dataSize < 0x10) || (*assignment._reader.data != 1)) {
      pEVar2 = this->errorReporter;
      Expression::Param::Reader::getValue((Reader *)&_field2208,&assignment);
      kj::str<char_const(&)[20]>((String *)&groupField,(kj *)"Missing field name.",params);
      SVar16.raw = (RawBrandedSchema *)0x4706a1;
      if (groupField._8_8_ != 0) {
        SVar16 = groupField.parent.super_Schema.raw;
      }
      SVar17.content.size_ = groupField._8_8_ + (ulong)(groupField._8_8_ == 0);
      SVar17.content.ptr = (char *)SVar16.raw;
      ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader>
                (pEVar2,(Reader *)&_field2208,SVar17);
LAB_00349d25:
      kj::Array<char>::~Array((Array<char> *)&groupField);
    }
    else {
      Expression::Param::Reader::getNamed(&fieldName,&assignment);
      groupFields.parent = (StructSchema)(StructSchema)builder.schema.super_Schema.raw;
      SVar17.content = (ArrayPtr<const_char>)LocatedText::Reader::getValue(&fieldName);
      StructSchema::findFieldByName
                ((Maybe<capnp::StructSchema::Field> *)&groupField,&groupFields.parent,SVar17);
      pWVar4 = groupField.proto._reader.pointers;
      _field2208.isSet = (bool)(char)groupField.parent.super_Schema.raw;
      if ((char)groupField.parent.super_Schema.raw != '\x01') {
        pEVar2 = this->errorReporter;
        groupFields._0_16_ = LocatedText::Reader::getValue(&fieldName);
        kj::str<char_const(&)[28],capnp::Text::Reader,char_const(&)[3]>
                  ((String *)&groupField,(kj *)"Struct has no field named \'",
                   (char (*) [28])&groupFields,(Reader *)0x4e3abc,in_R8);
        SVar16.raw = (RawBrandedSchema *)0x4706a1;
        if (groupField._8_8_ != 0) {
          SVar16 = groupField.parent.super_Schema.raw;
        }
        message.content.size_ = groupField._8_8_ + (ulong)(groupField._8_8_ == 0);
        message.content.ptr = (char *)SVar16.raw;
        ErrorReporter::addErrorOn<capnp::compiler::LocatedText::Reader&>(pEVar2,&fieldName,message);
        goto LAB_00349d25;
      }
      _field2208.field_1._48_8_ = groupField.proto._reader._40_8_;
      uVar9 = _field2208.field_1._48_8_;
      _field2208.field_1._56_8_ = uStack_2c0;
      _field2208.field_1.value.proto._reader.data = groupField.proto._reader.pointers;
      _field2208.field_1.value.proto._reader.pointers =
           (WirePointer *)groupField.proto._reader._32_8_;
      _field2208.field_1.value.proto._reader.segment =
           (SegmentReader *)groupField.proto._reader.capTable;
      _field2208.field_1.value.proto._reader.capTable =
           (CapTableReader *)groupField.proto._reader.data;
      _field2208.field_1.value.parent.super_Schema.raw =
           (StructSchema)(StructSchema)groupField._8_8_;
      _field2208.field_1._8_8_ = groupField.proto._reader.segment;
      _field2208.field_1.value.proto._reader.dataSize = groupField.proto._reader.nestingLimit;
      uVar11 = _field2208.field_1.value.proto._reader.dataSize;
      _field2208.field_1._48_8_ = uVar9;
      Expression::Param::Reader::getValue(&value,&assignment);
      uVar9 = value._reader._40_8_;
      pWVar8 = value._reader.pointers;
      pvVar7 = value._reader.data;
      pCVar6 = value._reader.capTable;
      pSVar5 = value._reader.segment;
      if (((uint)uVar11 < 0x50) || (sVar1 = (short)pWVar4[1].offsetAndKind.value, sVar1 == 0)) {
        src._reader.pointerCount = value._reader.pointerCount;
        src._reader._38_2_ = value._reader._38_2_;
        src._reader.dataSize = value._reader.dataSize;
        TVar18 = StructSchema::Field::getType(&_field2208.field_1.value);
        uVar10 = value._reader._40_8_;
        src._reader.capTable = pCVar6;
        src._reader.segment = pSVar5;
        src._reader.data = pvVar7;
        src._reader.pointers = pWVar8;
        value._reader.nestingLimit = (int)uVar9;
        value._reader._44_4_ = SUB84(uVar9,4);
        src._reader.nestingLimit = value._reader.nestingLimit;
        src._reader._44_4_ = value._reader._44_4_;
        value._reader._40_8_ = uVar10;
        compileValue((Maybe<capnp::Orphan<capnp::DynamicValue>_> *)&groupFields,this,src,TVar18);
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&groupField,
                   (NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&groupFields);
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&groupFields);
        if ((char)groupField.parent.super_Schema.raw == '\x01') {
          field._8_8_ = _field2208.field_1._8_8_;
          field.parent.super_Schema.raw =
               (Schema)(Schema)_field2208.field_1.value.parent.super_Schema.raw;
          field.proto._reader.segment = _field2208.field_1.value.proto._reader.segment;
          field.proto._reader.capTable = _field2208.field_1.value.proto._reader.capTable;
          field.proto._reader.data = _field2208.field_1.value.proto._reader.data;
          field.proto._reader.pointers = _field2208.field_1.value.proto._reader.pointers;
          field.proto._reader.dataSize = _field2208.field_1._48_4_;
          field.proto._reader.pointerCount = _field2208.field_1._52_2_;
          field.proto._reader._38_2_ = _field2208.field_1._54_2_;
          field.proto._reader._40_8_ = _field2208.field_1._56_8_;
          DynamicStruct::Builder::adopt
                    (&builder,field,(Orphan<capnp::DynamicValue> *)&groupField.index);
        }
        kj::_::NullableValue<capnp::Orphan<capnp::DynamicValue>_>::~NullableValue
                  ((NullableValue<capnp::Orphan<capnp::DynamicValue>_> *)&groupField);
      }
      else if (sVar1 == 1) {
        DynamicStruct::Builder::init((Builder *)&groupField,(EVP_PKEY_CTX *)&builder);
        DynamicValue::Builder::AsImpl<capnp::DynamicStruct,_(capnp::Kind)7>::apply
                  (&groupBuilder,(Builder *)&groupField);
        DynamicValue::Builder::~Builder((Builder *)&groupField);
        uVar9 = groupBuilder.builder._32_8_;
        pWVar4 = groupBuilder.builder.pointers;
        pvVar7 = groupBuilder.builder.data;
        pCVar14 = groupBuilder.builder.capTable;
        pSVar13 = groupBuilder.builder.segment;
        SVar12 = groupBuilder.schema;
        if ((value._reader.dataSize < 0x10) || (*value._reader.data != 7)) {
          groupField.parent = groupBuilder.schema;
          StructSchema::getFields(&groupFields,&groupField.parent);
          if (groupFields.list.reader.elementCount != 0) {
            StructSchema::FieldList::operator[](&groupField,&groupFields,0);
            uVar9 = value._reader._40_8_;
            pWVar4 = value._reader.pointers;
            pvVar7 = value._reader.data;
            pCVar6 = value._reader.capTable;
            pSVar5 = value._reader.segment;
            src_00._reader.pointerCount = value._reader.pointerCount;
            src_00._reader._38_2_ = value._reader._38_2_;
            src_00._reader.dataSize = value._reader.dataSize;
            TVar18 = StructSchema::Field::getType(&_field2208.field_1.value);
            uVar10 = value._reader._40_8_;
            src_00._reader.capTable = pCVar6;
            src_00._reader.segment = pSVar5;
            src_00._reader.data = pvVar7;
            src_00._reader.pointers = pWVar4;
            value._reader.nestingLimit = (int)uVar9;
            value._reader._44_4_ = SUB84(uVar9,4);
            src_00._reader.nestingLimit = value._reader.nestingLimit;
            src_00._reader._44_4_ = value._reader._44_4_;
            value._reader._40_8_ = uVar10;
            compileValueInner(&result,this,src_00,TVar18);
            uVar9 = value._reader._40_8_;
            pWVar4 = value._reader.pointers;
            pvVar7 = value._reader.data;
            pCVar6 = value._reader.capTable;
            pSVar5 = value._reader.segment;
            src_01._reader.pointerCount = value._reader.pointerCount;
            src_01._reader._38_2_ = value._reader._38_2_;
            src_01._reader.dataSize = value._reader.dataSize;
            TVar18 = StructSchema::Field::getType(&groupField);
            uVar10 = value._reader._40_8_;
            src_01._reader.capTable = pCVar6;
            src_01._reader.segment = pSVar5;
            src_01._reader.data = pvVar7;
            src_01._reader.pointers = pWVar4;
            value._reader.nestingLimit = (int)uVar9;
            value._reader._44_4_ = SUB84(uVar9,4);
            src_01._reader.nestingLimit = value._reader.nestingLimit;
            src_01._reader._44_4_ = value._reader._44_4_;
            value._reader._40_8_ = uVar10;
            bVar15 = matchesType(this,src_01,TVar18,&result);
            if (bVar15) {
              field_00.index = groupField.index;
              field_00._12_4_ = groupField._12_4_;
              field_00.parent = (StructSchema)(StructSchema)groupField.parent.super_Schema.raw;
              field_00.proto._reader.segment = groupField.proto._reader.segment;
              field_00.proto._reader.capTable = groupField.proto._reader.capTable;
              field_00.proto._reader.data = groupField.proto._reader.data;
              field_00.proto._reader.pointers = groupField.proto._reader.pointers;
              field_00.proto._reader.dataSize = groupField.proto._reader.dataSize;
              field_00.proto._reader.pointerCount = groupField.proto._reader.pointerCount;
              field_00.proto._reader._38_2_ = groupField.proto._reader._38_2_;
              field_00.proto._reader.nestingLimit = groupField.proto._reader.nestingLimit;
              field_00.proto._reader._44_4_ = groupField.proto._reader._44_4_;
              DynamicStruct::Builder::adopt(&groupBuilder,field_00,&result);
            }
            capnp::_::OrphanBuilder::~OrphanBuilder(&result.builder);
            if (bVar15) goto LAB_00349d2f;
          }
          message_00.content.size_ = 0x1f;
          message_00.content.ptr = "Type mismatch; expected group.";
          ErrorReporter::addErrorOn<capnp::compiler::Expression::Reader&>
                    (this->errorReporter,&value,message_00);
        }
        else {
          Expression::Reader::getTuple(&local_c0,&value);
          uVar10 = groupBuilder.builder._32_8_;
          builder_00.builder.segment = pSVar13;
          builder_00.schema = (StructSchema)(StructSchema)SVar12.super_Schema.raw;
          builder_00.builder.capTable = pCVar14;
          builder_00.builder.data = pvVar7;
          builder_00.builder.pointers = pWVar4;
          groupBuilder.builder.dataSize = (StructDataBitCount)uVar9;
          groupBuilder.builder.pointerCount = SUB82(uVar9,4);
          groupBuilder.builder._38_2_ = SUB82(uVar9,6);
          builder_00.builder.dataSize = groupBuilder.builder.dataSize;
          builder_00.builder.pointerCount = groupBuilder.builder.pointerCount;
          builder_00.builder._38_2_ = groupBuilder.builder._38_2_;
          assignments_00.reader.capTable = local_c0.reader.capTable;
          assignments_00.reader.segment = local_c0.reader.segment;
          assignments_00.reader.ptr = local_c0.reader.ptr;
          assignments_00.reader.elementCount = local_c0.reader.elementCount;
          assignments_00.reader.step = local_c0.reader.step;
          assignments_00.reader.structDataSize = local_c0.reader.structDataSize;
          assignments_00.reader.structPointerCount = local_c0.reader.structPointerCount;
          assignments_00.reader.elementSize = local_c0.reader.elementSize;
          assignments_00.reader._39_1_ = local_c0.reader._39_1_;
          assignments_00.reader.nestingLimit = local_c0.reader.nestingLimit;
          assignments_00.reader._44_4_ = local_c0.reader._44_4_;
          groupBuilder.builder._32_8_ = uVar10;
          fillStructValue(this,builder_00,assignments_00);
        }
      }
    }
LAB_00349d2f:
    local_280.index = local_280.index + 1;
  } while( true );
}

Assistant:

void ValueTranslator::fillStructValue(DynamicStruct::Builder builder,
                                      List<Expression::Param>::Reader assignments) {
  for (auto assignment: assignments) {
    if (assignment.isNamed()) {
      auto fieldName = assignment.getNamed();
      KJ_IF_SOME(field, builder.getSchema().findFieldByName(fieldName.getValue())) {
        auto fieldProto = field.getProto();
        auto value = assignment.getValue();

        switch (fieldProto.which()) {
          case schema::Field::SLOT:
            KJ_IF_SOME(compiledValue, compileValue(value, field.getType())) {
              builder.adopt(field, kj::mv(compiledValue));
            }
            break;

          case schema::Field::GROUP:
            auto groupBuilder = builder.init(field).as<DynamicStruct>();
            if (value.isTuple()) {
              fillStructValue(groupBuilder, value.getTuple());
            } else {
              auto groupFields = groupBuilder.getSchema().getFields();
              if (groupFields.size() > 0) {
                auto groupField = groupFields[0];

                // Call compileValueInner() using the group's type as `type`. Since we already
                // established `value` is not a tuple, this will only return a valid result if
                // the value has unambiguous type.
                auto result = compileValueInner(value, field.getType());

                // Does it match the first field?
                if (matchesType(value, groupField.getType(), result)) {
                  groupBuilder.adopt(groupField, kj::mv(result));
                  break;
                }
              }

              errorReporter.addErrorOn(value, "Type mismatch; expected group.");
            }
            break;
        }
      } else {
        errorReporter.addErrorOn(fieldName, kj::str(
            "Struct has no field named '", fieldName.getValue(), "'."));
      }
    } else {
      errorReporter.addErrorOn(assignment.getValue(), kj::str("Missing field name."));
    }
  }
}